

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.cc
# Opt level: O2

void __thiscall iqxmlrpc::http::Header::set_content_length(Header *this,size_t len)

{
  allocator<char> local_52;
  allocator<char> local_51;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"content-length",(allocator<char> *)&local_30);
  set_option(this,&local_50,len);
  std::__cxx11::string::~string((string *)&local_50);
  if (len != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"content-type",&local_51)
    ;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"text/xml",&local_52);
    set_option(this,&local_50,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

void Header::set_content_length(size_t len)
{
  set_option(names::content_length, len);

  if (len)
    set_option(names::content_type, "text/xml");
}